

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O1

int read_uint16_array(coda_cursor *cursor,uint16_t *dst,coda_array_ordering array_ordering)

{
  coda_backend cVar1;
  int iVar2;
  
  cVar1 = (cursor->stack[(long)cursor->n + -1].type)->backend;
  switch(cVar1) {
  case coda_backend_memory:
    iVar2 = coda_mem_cursor_read_uint16_array(cursor,dst,array_ordering);
    return iVar2;
  case coda_backend_hdf4:
    iVar2 = -0xb;
    break;
  case coda_backend_hdf5:
    iVar2 = -0xd;
    break;
  case coda_backend_cdf:
    iVar2 = coda_cdf_cursor_read_uint16_array(cursor,dst);
    if (iVar2 != 0) {
      return -1;
    }
    goto LAB_0014bc54;
  case coda_backend_netcdf:
  case coda_backend_grib:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                  ,0x3c8,
                  "int read_uint16_array(const coda_cursor *, uint16_t *, coda_array_ordering)");
  default:
    if (cVar1 == coda_backend_binary) {
      iVar2 = coda_bin_cursor_read_uint16_array(cursor,dst,array_ordering);
      return iVar2;
    }
    if (cVar1 == coda_backend_ascii) {
      iVar2 = coda_ascii_cursor_read_uint16_array(cursor,dst,array_ordering);
      return iVar2;
    }
LAB_0014bc54:
    if (array_ordering == coda_array_ordering_c) {
      return 0;
    }
    iVar2 = transpose_array(cursor,dst,2);
    return iVar2;
  }
  coda_set_error(iVar2,(char *)0x0);
  return -1;
}

Assistant:

static int read_uint16_array(const coda_cursor *cursor, uint16_t *dst, coda_array_ordering array_ordering)
{
    switch (cursor->stack[cursor->n - 1].type->backend)
    {
        case coda_backend_ascii:
            return coda_ascii_cursor_read_uint16_array(cursor, dst, array_ordering);
        case coda_backend_binary:
            return coda_bin_cursor_read_uint16_array(cursor, dst, array_ordering);
        case coda_backend_memory:
            return coda_mem_cursor_read_uint16_array(cursor, dst, array_ordering);
        case coda_backend_hdf4:
#ifdef HAVE_HDF4
            if (coda_hdf4_cursor_read_uint16_array(cursor, dst) != 0)
            {
                return -1;
            }
            break;
#else
            coda_set_error(CODA_ERROR_NO_HDF4_SUPPORT, NULL);
            return -1;
#endif
        case coda_backend_hdf5:
#ifdef HAVE_HDF5
            if (coda_hdf5_cursor_read_uint16_array(cursor, dst) != 0)
            {
                return -1;
            }
            break;
#else
            coda_set_error(CODA_ERROR_NO_HDF5_SUPPORT, NULL);
            return -1;
#endif
        case coda_backend_cdf:
            if (coda_cdf_cursor_read_uint16_array(cursor, dst) != 0)
            {
                return -1;
            }
            break;
        case coda_backend_netcdf:
        case coda_backend_grib:
            assert(0);
            exit(1);
    }

    if (array_ordering != coda_array_ordering_c)
    {
        return transpose_array(cursor, dst, sizeof(uint16_t));
    }

    return 0;
}